

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O0

unsigned_long
Js::JavascriptArray::GetFromIndex<unsigned_long>
          (Var arg,unsigned_long length,ScriptContext *scriptContext,bool addWithLength)

{
  bool bVar1;
  int64 iVar2;
  double *pdVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined4 uVar7;
  undefined1 auVar6 [16];
  double local_60;
  double local_58;
  double local_50;
  long local_48 [2];
  double local_38;
  double value;
  unsigned_long fromIndex;
  ScriptContext *pSStack_20;
  bool addWithLength_local;
  ScriptContext *scriptContext_local;
  unsigned_long length_local;
  Var arg_local;
  
  value = 0.0;
  fromIndex._7_1_ = addWithLength;
  pSStack_20 = scriptContext;
  scriptContext_local = (ScriptContext *)length;
  length_local = (unsigned_long)arg;
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt64((Var)length_local);
    local_58 = (double)iVar2;
  }
  else {
    local_58 = JavascriptConversion::ToInteger((Var)length_local,pSStack_20);
  }
  local_38 = local_58;
  uVar7 = (undefined4)((ulong)scriptContext_local >> 0x20);
  if (0.0 <= local_58) {
    auVar5._8_4_ = uVar7;
    auVar5._0_8_ = scriptContext_local;
    auVar5._12_4_ = 0x45300000;
    local_50 = (auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)scriptContext_local) - 4503599627370496.0);
    pdVar3 = min<double>(&local_38,&local_50);
    uVar4 = (ulong)*pdVar3;
    value = (double)(uVar4 | (long)(*pdVar3 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
  }
  else {
    if ((fromIndex._7_1_ & 1) == 0) {
      local_60 = 0.0;
    }
    else {
      local_48[1] = 0;
      auVar6._8_4_ = uVar7;
      auVar6._0_8_ = scriptContext_local;
      auVar6._12_4_ = 0x45300000;
      local_48[0] = (long)(local_58 +
                          (auVar6._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)scriptContext_local) -
                          4503599627370496.0));
      pdVar3 = (double *)max<long>(local_48 + 1,local_48);
      local_60 = *pdVar3;
    }
    value = local_60;
  }
  return (unsigned_long)value;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }